

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::UpdateWindowManualResize
               (ImGuiWindow *window,ImVec2 *size_auto_fit,int *border_held,int resize_grip_count,
               ImU32 *resize_grip_col,ImRect *visibility_rect)

{
  float fVar1;
  bool bVar2;
  ImGuiContext *pIVar3;
  int iVar4;
  ImGuiID id;
  ImU32 IVar5;
  float *pfVar6;
  ImGuiMouseCursor IVar7;
  float fVar8;
  float fVar9;
  ImVec2 IVar10;
  ImRect IVar11;
  float local_218;
  float local_210;
  float local_20c;
  float local_204;
  bool local_1fd;
  ImGuiCol local_1fc;
  float local_1f8;
  float local_1f0;
  float local_1ec;
  float local_1e4;
  float local_1c8;
  ImVec2 local_1bc;
  ImVec2 local_1b4;
  ImVec2 local_1ac;
  ImVec2 local_1a4;
  ImVec2 local_19c;
  undefined4 local_194;
  ImVec2 IStack_190;
  float NAV_RESIZE_SPEED;
  ImVec2 local_188;
  ImVec2 local_180;
  ImVec2 nav_resize_delta;
  ImVec2 local_160;
  ImVec2 border_target;
  ImVec2 clamp_max_1;
  ImVec2 clamp_min_1;
  ImGuiID border_id;
  ImRect border_rect;
  bool held_1;
  bool hovered_1;
  ImGuiAxis axis;
  ImGuiResizeBorderDef *def_1;
  int border_n;
  ImVec2 local_108;
  ImVec2 local_100;
  ImVec2 local_f8;
  ImVec2 local_f0;
  ImVec2 local_e8;
  ImVec2 corner_target;
  ImVec2 clamp_max;
  ImVec2 clamp_min;
  ImVec2 IStack_c4;
  ImGuiID resize_grip_id;
  ImVec2 local_bc;
  ImVec2 local_b4;
  ImVec2 local_ac;
  undefined1 local_a4 [8];
  ImRect resize_rect;
  bool held;
  bool hovered;
  ImVec2 local_88;
  ImVec2 corner;
  ImGuiResizeGripDef *def;
  float fStack_70;
  int resize_grip_n;
  ImVec2 size_target;
  ImVec2 pos_target;
  float grip_hover_outer_size;
  float grip_hover_inner_size;
  float grip_draw_size;
  int resize_border_count;
  bool ret_auto_fit;
  ImGuiWindowFlags flags;
  ImGuiContext *g;
  ImRect *visibility_rect_local;
  ImU32 *resize_grip_col_local;
  int resize_grip_count_local;
  int *border_held_local;
  ImVec2 *size_auto_fit_local;
  ImGuiWindow *window_local;
  
  pIVar3 = GImGui;
  if (((((window->Flags & 2U) != 0) || ((window->Flags & 0x40U) != 0)) ||
      ('\0' < window->AutoFitFramesX)) || ('\0' < window->AutoFitFramesY)) {
    return false;
  }
  if ((window->WasActive & 1U) == 0) {
    return false;
  }
  bVar2 = false;
  iVar4 = 0;
  if (((GImGui->IO).ConfigWindowsResizeFromEdges & 1U) != 0) {
    iVar4 = 4;
  }
  fVar8 = ImMax<float>(GImGui->FontSize * 1.35,GImGui->FontSize * 0.2 + window->WindowRounding + 1.0
                      );
  fVar8 = (float)(int)((float)(int)fVar8 * 0.75);
  local_1c8 = 4.0;
  if (((pIVar3->IO).ConfigWindowsResizeFromEdges & 1U) == 0) {
    local_1c8 = 0.0;
  }
  ImVec2::ImVec2(&size_target,3.4028235e+38,3.4028235e+38);
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff90,3.4028235e+38,3.4028235e+38);
  (window->DC).NavLayerCurrent = ImGuiNavLayer_Menu;
  PushID("#RESIZE");
  for (def._4_4_ = 0; (int)def._4_4_ < resize_grip_count; def._4_4_ = def._4_4_ + 1) {
    corner = (ImVec2)(resize_grip_def + (int)def._4_4_);
    register0x00001200 = ::operator+(&window->Pos,&window->Size);
    local_88 = ImLerp(&window->Pos,(ImVec2 *)&resize_rect.Max.y,(ImVec2 *)corner);
    local_b4 = ::operator*((ImVec2 *)((long)corner + 8),local_1c8);
    local_ac = operator-(&local_88,&local_b4);
    IStack_c4 = ::operator*((ImVec2 *)((long)corner + 8),fVar8);
    local_bc = ::operator+(&local_88,&stack0xffffffffffffff3c);
    ImRect::ImRect((ImRect *)local_a4,&local_ac,&local_bc);
    if (resize_rect.Min.x < (float)local_a4._0_4_) {
      ImSwap<float>((float *)local_a4,(float *)&resize_rect);
    }
    if (resize_rect.Min.y < (float)local_a4._4_4_) {
      ImSwap<float>((float *)(local_a4 + 4),&resize_rect.Min.y);
    }
    id = ImGuiWindow::GetID(window,def._4_4_);
    ButtonBehavior((ImRect *)local_a4,id,(bool *)((long)&resize_rect.Max.x + 3),
                   (bool *)((long)&resize_rect.Max.x + 2),0x40800);
    if (((resize_rect.Max.x._3_1_ & 1) != 0) || ((resize_rect.Max.x._2_1_ & 1) != 0)) {
      IVar7 = 6;
      if ((def._4_4_ & 1) != 0) {
        IVar7 = 5;
      }
      pIVar3->MouseCursor = IVar7;
    }
    if ((((resize_rect.Max.x._2_1_ & 1) == 0) || (((pIVar3->IO).MouseDoubleClicked[0] & 1U) == 0))
       || (def._4_4_ != 0)) {
      if ((resize_rect.Max.x._2_1_ & 1) != 0) {
        if ((*(float *)corner != 1.0) || (NAN(*(float *)corner))) {
          local_1e4 = -3.4028235e+38;
        }
        else {
          local_1e4 = (visibility_rect->Min).x;
        }
        if ((*(float *)((long)corner + 4) != 1.0) || (NAN(*(float *)((long)corner + 4)))) {
          local_1ec = -3.4028235e+38;
        }
        else {
          local_1ec = (visibility_rect->Min).y;
        }
        ImVec2::ImVec2(&clamp_max,local_1e4,local_1ec);
        if ((*(float *)corner != 0.0) || (NAN(*(float *)corner))) {
          local_1f0 = 3.4028235e+38;
        }
        else {
          local_1f0 = (visibility_rect->Max).x;
        }
        if ((*(float *)((long)corner + 4) != 0.0) || (NAN(*(float *)((long)corner + 4)))) {
          local_1f8 = 3.4028235e+38;
        }
        else {
          local_1f8 = (visibility_rect->Max).y;
        }
        ImVec2::ImVec2(&corner_target,local_1f0,local_1f8);
        local_f0 = operator-(&(pIVar3->IO).MousePos,&pIVar3->ActiveIdClickOffset);
        local_100 = ::operator*((ImVec2 *)((long)corner + 8),local_1c8);
        local_108 = ::operator*((ImVec2 *)((long)corner + 8),-fVar8);
        local_f8 = ImLerp(&local_100,&local_108,(ImVec2 *)corner);
        local_e8 = ::operator+(&local_f0,&local_f8);
        local_e8 = ImClamp(&local_e8,&clamp_max,corner_target);
        CalcResizePosSizeFromAnyCorner
                  (window,&local_e8,(ImVec2 *)corner,&size_target,(ImVec2 *)&stack0xffffffffffffff90
                  );
      }
    }
    else {
      _fStack_70 = CalcWindowSizeAfterConstraint(window,size_auto_fit);
      bVar2 = true;
      ClearActiveID();
    }
    if (((def._4_4_ == 0) || ((resize_rect.Max.x._2_1_ & 1) != 0)) ||
       ((resize_rect.Max.x._3_1_ & 1) != 0)) {
      if ((resize_rect.Max.x._2_1_ & 1) == 0) {
        local_1fc = 0x1e;
        if ((resize_rect.Max.x._3_1_ & 1) != 0) {
          local_1fc = 0x1f;
        }
      }
      else {
        local_1fc = 0x20;
      }
      IVar5 = GetColorU32(local_1fc,1.0);
      resize_grip_col[(int)def._4_4_] = IVar5;
    }
  }
  for (def_1._4_4_ = 0; (int)def_1._4_4_ < iVar4; def_1._4_4_ = def_1._4_4_ + 1) {
    local_1fd = def_1._4_4_ < 2;
    border_rect.Max.y = (float)((byte)~local_1fd & 1);
    IVar11 = GetResizeBorderRect(window,def_1._4_4_,fVar8,4.0);
    register0x00001200 = IVar11.Min;
    border_rect.Min = IVar11.Max;
    clamp_min_1.x = (float)ImGuiWindow::GetID(window,def_1._4_4_ + 4);
    ButtonBehavior((ImRect *)&clamp_min_1.y,(ImGuiID)clamp_min_1.x,
                   (bool *)((long)&border_rect.Max.x + 3),(bool *)((long)&border_rect.Max.x + 2),
                   0x800);
    if ((((border_rect.Max.x._3_1_ & 1) != 0) && (0.04 < pIVar3->HoveredIdTimer)) ||
       ((border_rect.Max.x._2_1_ & 1) != 0)) {
      IVar7 = 3;
      if (border_rect.Max.y == 0.0) {
        IVar7 = 4;
      }
      pIVar3->MouseCursor = IVar7;
      if ((border_rect.Max.x._2_1_ & 1) != 0) {
        *border_held = def_1._4_4_;
      }
    }
    if ((border_rect.Max.x._2_1_ & 1) != 0) {
      if (def_1._4_4_ == 1) {
        local_204 = (visibility_rect->Min).x;
      }
      else {
        local_204 = -3.4028235e+38;
      }
      if (def_1._4_4_ == 3) {
        local_20c = (visibility_rect->Min).y;
      }
      else {
        local_20c = -3.4028235e+38;
      }
      ImVec2::ImVec2(&clamp_max_1,local_204,local_20c);
      if (def_1._4_4_ == 0) {
        local_210 = (visibility_rect->Max).x;
      }
      else {
        local_210 = 3.4028235e+38;
      }
      if (def_1._4_4_ == 2) {
        local_218 = (visibility_rect->Max).y;
      }
      else {
        local_218 = 3.4028235e+38;
      }
      ImVec2::ImVec2((ImVec2 *)&border_target.y,local_210,local_218);
      local_160 = window->Pos;
      pfVar6 = ImVec2::operator[](&(pIVar3->IO).MousePos,(long)(int)border_rect.Max.y);
      fVar9 = *pfVar6;
      pfVar6 = ImVec2::operator[](&pIVar3->ActiveIdClickOffset,(long)(int)border_rect.Max.y);
      fVar1 = *pfVar6;
      pfVar6 = ImVec2::operator[](&local_160,(long)(int)border_rect.Max.y);
      *pfVar6 = (fVar9 - fVar1) + 4.0;
      local_160 = ImClamp(&local_160,&clamp_max_1,stack0xfffffffffffffeac);
      nav_resize_delta =
           ImMin(&resize_border_def[(int)def_1._4_4_].SegmentN1,
                 &resize_border_def[(int)def_1._4_4_].SegmentN2);
      CalcResizePosSizeFromAnyCorner
                (window,&local_160,&nav_resize_delta,&size_target,(ImVec2 *)&stack0xffffffffffffff90
                );
    }
  }
  PopID();
  (window->DC).NavLayerCurrent = ImGuiNavLayer_Main;
  if ((pIVar3->NavWindowingTarget != (ImGuiWindow *)0x0) &&
     (pIVar3->NavWindowingTarget->RootWindow == window)) {
    ImVec2::ImVec2(&local_180);
    if ((pIVar3->NavInputSource == ImGuiInputSource_Keyboard) && (((pIVar3->IO).KeyShift & 1U) != 0)
       ) {
      local_188 = GetNavInputAmount2d(1,ImGuiInputReadMode_Down,0.0,0.0);
      local_180 = local_188;
    }
    if (pIVar3->NavInputSource == ImGuiInputSource_Gamepad) {
      IStack_190 = GetNavInputAmount2d(2,ImGuiInputReadMode_Down,0.0,0.0);
      local_180 = IStack_190;
    }
    if ((local_180.x == 0.0) && (!NAN(local_180.x))) {
      if ((local_180.y == 0.0) && (!NAN(local_180.y))) goto LAB_00167310;
    }
    local_194 = 0x44160000;
    fVar8 = (pIVar3->IO).DeltaTime;
    fVar9 = ImMin<float>((pIVar3->IO).DisplayFramebufferScale.x,
                         (pIVar3->IO).DisplayFramebufferScale.y);
    fVar8 = ImFloor(fVar8 * 600.0 * fVar9);
    operator*=(&local_180,fVar8);
    local_1ac = operator-(&visibility_rect->Min,&window->Pos);
    local_1a4 = operator-(&local_1ac,&window->Size);
    local_19c = ImMax(&local_180,&local_1a4);
    pIVar3->NavWindowingToggleLayer = false;
    pIVar3->NavDisableMouseHover = true;
    local_180 = local_19c;
    IVar5 = GetColorU32(0x20,1.0);
    *resize_grip_col = IVar5;
    local_1bc = ::operator+(&window->SizeFull,&local_180);
    local_1b4 = CalcWindowSizeAfterConstraint(window,&local_1bc);
    _fStack_70 = local_1b4;
  }
LAB_00167310:
  if ((fStack_70 != 3.4028235e+38) || (NAN(fStack_70))) {
    window->SizeFull = _fStack_70;
    MarkIniSettingsDirty(window);
  }
  if ((size_target.x != 3.4028235e+38) || (NAN(size_target.x))) {
    IVar10 = ImFloor(&size_target);
    window->Pos = IVar10;
    MarkIniSettingsDirty(window);
  }
  window->Size = window->SizeFull;
  return bVar2;
}

Assistant:

static bool ImGui::UpdateWindowManualResize(ImGuiWindow* window, const ImVec2& size_auto_fit, int* border_held, int resize_grip_count, ImU32 resize_grip_col[4], const ImRect& visibility_rect)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindowFlags flags = window->Flags;

    if ((flags & ImGuiWindowFlags_NoResize) || (flags & ImGuiWindowFlags_AlwaysAutoResize) || window->AutoFitFramesX > 0 || window->AutoFitFramesY > 0)
        return false;
    if (window->WasActive == false) // Early out to avoid running this code for e.g. an hidden implicit/fallback Debug window.
        return false;

    bool ret_auto_fit = false;
    const int resize_border_count = g.IO.ConfigWindowsResizeFromEdges ? 4 : 0;
    const float grip_draw_size = IM_FLOOR(ImMax(g.FontSize * 1.35f, window->WindowRounding + 1.0f + g.FontSize * 0.2f));
    const float grip_hover_inner_size = IM_FLOOR(grip_draw_size * 0.75f);
    const float grip_hover_outer_size = g.IO.ConfigWindowsResizeFromEdges ? WINDOWS_HOVER_PADDING : 0.0f;

    ImVec2 pos_target(FLT_MAX, FLT_MAX);
    ImVec2 size_target(FLT_MAX, FLT_MAX);

    // Resize grips and borders are on layer 1
    window->DC.NavLayerCurrent = ImGuiNavLayer_Menu;

    // Manual resize grips
    PushID("#RESIZE");
    for (int resize_grip_n = 0; resize_grip_n < resize_grip_count; resize_grip_n++)
    {
        const ImGuiResizeGripDef& def = resize_grip_def[resize_grip_n];
        const ImVec2 corner = ImLerp(window->Pos, window->Pos + window->Size, def.CornerPosN);

        // Using the FlattenChilds button flag we make the resize button accessible even if we are hovering over a child window
        bool hovered, held;
        ImRect resize_rect(corner - def.InnerDir * grip_hover_outer_size, corner + def.InnerDir * grip_hover_inner_size);
        if (resize_rect.Min.x > resize_rect.Max.x) ImSwap(resize_rect.Min.x, resize_rect.Max.x);
        if (resize_rect.Min.y > resize_rect.Max.y) ImSwap(resize_rect.Min.y, resize_rect.Max.y);
        ImGuiID resize_grip_id = window->GetID(resize_grip_n); // == GetWindowResizeCornerID()
        ButtonBehavior(resize_rect, resize_grip_id, &hovered, &held, ImGuiButtonFlags_FlattenChildren | ImGuiButtonFlags_NoNavFocus);
        //GetForegroundDrawList(window)->AddRect(resize_rect.Min, resize_rect.Max, IM_COL32(255, 255, 0, 255));
        if (hovered || held)
            g.MouseCursor = (resize_grip_n & 1) ? ImGuiMouseCursor_ResizeNESW : ImGuiMouseCursor_ResizeNWSE;

        if (held && g.IO.MouseDoubleClicked[0] && resize_grip_n == 0)
        {
            // Manual auto-fit when double-clicking
            size_target = CalcWindowSizeAfterConstraint(window, size_auto_fit);
            ret_auto_fit = true;
            ClearActiveID();
        }
        else if (held)
        {
            // Resize from any of the four corners
            // We don't use an incremental MouseDelta but rather compute an absolute target size based on mouse position
            ImVec2 clamp_min = ImVec2(def.CornerPosN.x == 1.0f ? visibility_rect.Min.x : -FLT_MAX, def.CornerPosN.y == 1.0f ? visibility_rect.Min.y : -FLT_MAX);
            ImVec2 clamp_max = ImVec2(def.CornerPosN.x == 0.0f ? visibility_rect.Max.x : +FLT_MAX, def.CornerPosN.y == 0.0f ? visibility_rect.Max.y : +FLT_MAX);
            ImVec2 corner_target = g.IO.MousePos - g.ActiveIdClickOffset + ImLerp(def.InnerDir * grip_hover_outer_size, def.InnerDir * -grip_hover_inner_size, def.CornerPosN); // Corner of the window corresponding to our corner grip
            corner_target = ImClamp(corner_target, clamp_min, clamp_max);
            CalcResizePosSizeFromAnyCorner(window, corner_target, def.CornerPosN, &pos_target, &size_target);
        }

        // Only lower-left grip is visible before hovering/activating
        if (resize_grip_n == 0 || held || hovered)
            resize_grip_col[resize_grip_n] = GetColorU32(held ? ImGuiCol_ResizeGripActive : hovered ? ImGuiCol_ResizeGripHovered : ImGuiCol_ResizeGrip);
    }
    for (int border_n = 0; border_n < resize_border_count; border_n++)
    {
        const ImGuiResizeBorderDef& def = resize_border_def[border_n];
        const ImGuiAxis axis = (border_n == ImGuiDir_Left || border_n == ImGuiDir_Right) ? ImGuiAxis_X : ImGuiAxis_Y;

        bool hovered, held;
        ImRect border_rect = GetResizeBorderRect(window, border_n, grip_hover_inner_size, WINDOWS_HOVER_PADDING);
        ImGuiID border_id = window->GetID(border_n + 4); // == GetWindowResizeBorderID()
        ButtonBehavior(border_rect, border_id, &hovered, &held, ImGuiButtonFlags_FlattenChildren);
        //GetForegroundDrawLists(window)->AddRect(border_rect.Min, border_rect.Max, IM_COL32(255, 255, 0, 255));
        if ((hovered && g.HoveredIdTimer > WINDOWS_RESIZE_FROM_EDGES_FEEDBACK_TIMER) || held)
        {
            g.MouseCursor = (axis == ImGuiAxis_X) ? ImGuiMouseCursor_ResizeEW : ImGuiMouseCursor_ResizeNS;
            if (held)
                *border_held = border_n;
        }
        if (held)
        {
            ImVec2 clamp_min(border_n == ImGuiDir_Right ? visibility_rect.Min.x : -FLT_MAX, border_n == ImGuiDir_Down ? visibility_rect.Min.y : -FLT_MAX);
            ImVec2 clamp_max(border_n == ImGuiDir_Left  ? visibility_rect.Max.x : +FLT_MAX, border_n == ImGuiDir_Up   ? visibility_rect.Max.y : +FLT_MAX);
            ImVec2 border_target = window->Pos;
            border_target[axis] = g.IO.MousePos[axis] - g.ActiveIdClickOffset[axis] + WINDOWS_HOVER_PADDING;
            border_target = ImClamp(border_target, clamp_min, clamp_max);
            CalcResizePosSizeFromAnyCorner(window, border_target, ImMin(def.SegmentN1, def.SegmentN2), &pos_target, &size_target);
        }
    }
    PopID();

    // Restore nav layer
    window->DC.NavLayerCurrent = ImGuiNavLayer_Main;

    // Navigation resize (keyboard/gamepad)
    if (g.NavWindowingTarget && g.NavWindowingTarget->RootWindow == window)
    {
        ImVec2 nav_resize_delta;
        if (g.NavInputSource == ImGuiInputSource_Keyboard && g.IO.KeyShift)
            nav_resize_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard, ImGuiInputReadMode_Down);
        if (g.NavInputSource == ImGuiInputSource_Gamepad)
            nav_resize_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_Down);
        if (nav_resize_delta.x != 0.0f || nav_resize_delta.y != 0.0f)
        {
            const float NAV_RESIZE_SPEED = 600.0f;
            nav_resize_delta *= ImFloor(NAV_RESIZE_SPEED * g.IO.DeltaTime * ImMin(g.IO.DisplayFramebufferScale.x, g.IO.DisplayFramebufferScale.y));
            nav_resize_delta = ImMax(nav_resize_delta, visibility_rect.Min - window->Pos - window->Size);
            g.NavWindowingToggleLayer = false;
            g.NavDisableMouseHover = true;
            resize_grip_col[0] = GetColorU32(ImGuiCol_ResizeGripActive);
            // FIXME-NAV: Should store and accumulate into a separate size buffer to handle sizing constraints properly, right now a constraint will make us stuck.
            size_target = CalcWindowSizeAfterConstraint(window, window->SizeFull + nav_resize_delta);
        }
    }

    // Apply back modified position/size to window
    if (size_target.x != FLT_MAX)
    {
        window->SizeFull = size_target;
        MarkIniSettingsDirty(window);
    }
    if (pos_target.x != FLT_MAX)
    {
        window->Pos = ImFloor(pos_target);
        MarkIniSettingsDirty(window);
    }

    window->Size = window->SizeFull;
    return ret_auto_fit;
}